

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

CuePoint * __thiscall mkvparser::Cues::GetLast(Cues *this)

{
  CuePoint *pCVar1;
  CuePoint *pCVar2;
  
  if ((this->m_cue_points != (CuePoint **)0x0) && (0 < this->m_count)) {
    pCVar1 = this->m_cue_points[this->m_count + -1];
    if (pCVar1 != (CuePoint *)0x0) {
      pCVar2 = (CuePoint *)0x0;
      if (-1 < pCVar1->m_timecode) {
        pCVar2 = pCVar1;
      }
      return pCVar2;
    }
  }
  return (CuePoint *)0x0;
}

Assistant:

const CuePoint* Cues::GetLast() const {
  if (m_cue_points == NULL || m_count <= 0)
    return NULL;

  const long index = m_count - 1;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[index];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}